

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectionMatrix4.h
# Opt level: O0

void __thiscall
Gs::ProjectionMatrix4T<float>::ToMatrix4(ProjectionMatrix4T<float> *this,Matrix<float,_4UL,_4UL> *m)

{
  float fVar1;
  float *pfVar2;
  Matrix<float,_4UL,_4UL> *m_local;
  ProjectionMatrix4T<float> *this_local;
  
  fVar1 = this->m00;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,0);
  *pfVar2 = fVar1;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,0);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,0);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,0);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,1);
  *pfVar2 = 0.0;
  fVar1 = this->m11;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,1);
  *pfVar2 = fVar1;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,1);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,1);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,2);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,2);
  *pfVar2 = 0.0;
  fVar1 = this->m22;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,2);
  *pfVar2 = fVar1;
  fVar1 = this->m32;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,2);
  *pfVar2 = fVar1;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,3);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,3);
  *pfVar2 = 0.0;
  fVar1 = this->m23;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,3);
  *pfVar2 = fVar1;
  fVar1 = this->m33;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,3);
  *pfVar2 = fVar1;
  return;
}

Assistant:

void ToMatrix4(Matrix<T, 4, 4>& m) const
        {
            m.At(0, 0) = m00;
            m.At(1, 0) = T(0);
            m.At(2, 0) = T(0);
            m.At(3, 0) = T(0);

            m.At(0, 1) = T(0);
            m.At(1, 1) = m11;
            m.At(2, 1) = T(0);
            m.At(3, 1) = T(0);

            m.At(0, 2) = T(0);
            m.At(1, 2) = T(0);
            m.At(2, 2) = m22;
            m.At(3, 2) = m32;

            m.At(0, 3) = T(0);
            m.At(1, 3) = T(0);
            m.At(2, 3) = m23;
            m.At(3, 3) = m33;
        }